

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

string * cmCatViews_abi_cxx11_
                   (string *__return_storage_ptr__,
                   initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views)

{
  size_t __n;
  long lVar1;
  size_type sVar2;
  char cVar3;
  iterator pbVar4;
  pointer __dest;
  unsigned_long __n2;
  long lVar5;
  
  sVar2 = views._M_len;
  pbVar4 = views._M_array;
  if (sVar2 == 0) {
    cVar3 = '\0';
  }
  else {
    lVar1 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + *(long *)((long)&pbVar4->_M_len + lVar1);
      cVar3 = (char)lVar5;
      lVar1 = lVar1 + 0x10;
    } while (sVar2 << 4 != lVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar3);
  if (sVar2 != 0) {
    __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
    lVar1 = 0;
    do {
      __n = *(size_t *)((long)&pbVar4->_M_len + lVar1);
      if (__n != 0) {
        memmove(__dest,*(void **)((long)&pbVar4->_M_str + lVar1),__n);
        __dest = __dest + __n;
      }
      lVar1 = lVar1 + 0x10;
    } while (sVar2 << 4 != lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCatViews(std::initializer_list<cm::string_view> views)
{
  std::size_t total_size = 0;
  for (cm::string_view const& view : views) {
    total_size += view.size();
  }

  std::string result(total_size, '\0');
  std::string::iterator sit = result.begin();
  for (cm::string_view const& view : views) {
    sit = std::copy_n(view.data(), view.size(), sit);
  }
  return result;
}